

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  EasyCollector ecurl;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  code *local_80 [2];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  curl::Easy::Easy((Easy *)local_80);
  local_80[0] = __gmon_start__;
  local_68 = 0;
  local_60 = 0;
  local_48 = 0;
  local_40 = 0;
  local_70 = &local_60;
  local_50 = &local_40;
  iVar1 = curl::Easy::perform_url((char *)local_80);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'P');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Result       : ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Document size: ",0xf);
  curl::EasyCollector::document_abi_cxx11_();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Debug size   : ",0xf);
  curl::EasyCollector::debug_abi_cxx11_();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'P');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  puVar3 = (undefined8 *)curl::EasyCollector::document_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*puVar3,puVar3[1]);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,'P');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_a0,local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  local_80[0] = __gmon_start__;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  curl::Easy::~Easy((Easy *)local_80);
  return 0;
}

Assistant:

int main() {
    constexpr auto width = 80;
    curl::EasyCollector ecurl; // our curl object

    CURLcode res = ecurl.perform_url("https://lyncon.se/curl-Easy-cpp.txt");

    std::cout
        << std::string(width, '-') << "\n"
        << "Result       : " << res << "\n"
        << "Document size: " << ecurl.document().size() << "\n"
        << "Debug size   : " << ecurl.debug().size() << "\n";

    std::cout
        << std::string(width, '-') << "\n"
        << ecurl.document()                 // print the captured document
        << std::string(width, '-') << "\n";
}